

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

bool helics::core::matchingTypes(string_view type1,string_view type2)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  bool bVar4;
  string_view type2_local;
  string_view type1_local;
  
  type1_local._M_str = type1._M_str;
  type2_local._M_str = type2._M_str;
  type2_local._M_len = type2._M_len;
  type1_local._M_len = type1._M_len;
  bVar1 = std::operator==(type1,type2);
  bVar4 = true;
  if (type2._M_len != 0 && (type1._M_len != 0 && !bVar1)) {
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&type1_local,0,3,"def");
    if (iVar2 != 0) {
      iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&type2_local,0,3,"def");
      if (iVar2 != 0) {
        pvVar3 = frozen::
                 set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                 ::find<std::basic_string_view<char,std::char_traits<char>>>
                           ((set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                             *)global_match_strings,&type1_local);
        if (pvVar3 == (const_iterator)coreTypes) {
          pvVar3 = frozen::
                   set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                               *)global_match_strings,&type2_local);
          bVar4 = pvVar3 != (const_iterator)coreTypes;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool matchingTypes(std::string_view type1, std::string_view type2)
{
    if (type1 == type2) {
        return true;
    }
    if ((type1.empty()) || (type2.empty())) {
        return true;
    }
    if ((type1.compare(0, 3, "def") == 0) || (type2.compare(0, 3, "def") == 0)) {
        return true;
    }
    const auto* res = global_match_strings.find(type1);
    if (res != global_match_strings.end()) {
        return true;
    }
    res = global_match_strings.find(type2);
    return (res != global_match_strings.end());
}